

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O2

RGB pbrt::PixelSensor::ProjectReflectance<pbrt::RGB>
              (SpectrumHandle *refl,SpectrumHandle *illum,SpectrumHandle *b1,SpectrumHandle *b2,
              SpectrumHandle *b3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Float FVar4;
  Float FVar5;
  Float FVar6;
  Float FVar7;
  Float FVar8;
  undefined1 auVar9 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar10 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float lambda;
  RGB RVar15;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  auVar13 = ZEXT816(0) << 0x40;
  local_78 = ZEXT816(0);
  local_88 = ZEXT416(0) << 0x40;
  for (lambda = 360.0; lambda <= 830.0; lambda = lambda + 1.0) {
    FVar4 = SpectrumHandle::operator()(b2,lambda);
    auVar10._0_4_ = SpectrumHandle::operator()(illum,lambda);
    auVar10._4_60_ = extraout_var;
    local_88 = vfmadd231ss_fma(local_88,auVar10._0_16_,ZEXT416((uint)FVar4));
    FVar4 = SpectrumHandle::operator()(b1,lambda);
    FVar5 = SpectrumHandle::operator()(refl,lambda);
    FVar6 = SpectrumHandle::operator()(illum,lambda);
    FVar7 = SpectrumHandle::operator()(b2,lambda);
    FVar8 = SpectrumHandle::operator()(refl,lambda);
    auVar11._0_4_ = SpectrumHandle::operator()(illum,lambda);
    auVar11._4_60_ = extraout_var_00;
    auVar1._4_4_ = extraout_XMM0_Db;
    auVar1._0_4_ = FVar4;
    auVar1._8_4_ = extraout_XMM0_Dc;
    auVar1._12_4_ = extraout_XMM0_Dd;
    auVar3._4_4_ = extraout_XMM0_Db_00;
    auVar3._0_4_ = FVar5;
    auVar3._8_4_ = extraout_XMM0_Dc_00;
    auVar3._12_4_ = extraout_XMM0_Dd_00;
    auVar2._4_4_ = extraout_XMM0_Db_01;
    auVar2._0_4_ = FVar6;
    auVar2._8_4_ = extraout_XMM0_Dc_01;
    auVar2._12_4_ = extraout_XMM0_Dd_01;
    auVar9 = vinsertps_avx(auVar1,ZEXT416((uint)FVar7),0x10);
    auVar1 = vinsertps_avx(auVar3,ZEXT416((uint)FVar8),0x10);
    auVar2 = vinsertps_avx(auVar2,auVar11._0_16_,0x10);
    auVar14._0_4_ = auVar9._0_4_ * auVar1._0_4_;
    auVar14._4_4_ = auVar9._4_4_ * auVar1._4_4_;
    auVar14._8_4_ = auVar9._8_4_ * auVar1._8_4_;
    auVar14._12_4_ = auVar9._12_4_ * auVar1._12_4_;
    local_78 = vfmadd231ps_fma(local_78,auVar14,auVar2);
    FVar4 = SpectrumHandle::operator()(b3,lambda);
    FVar5 = SpectrumHandle::operator()(refl,lambda);
    auVar12._0_4_ = SpectrumHandle::operator()(illum,lambda);
    auVar12._4_60_ = extraout_var_01;
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)auVar13._0_4_),auVar12._0_16_,
                              ZEXT416((uint)(FVar5 * FVar4)));
  }
  auVar9._4_4_ = local_88._0_4_;
  auVar9._0_4_ = local_88._0_4_;
  auVar9._8_4_ = local_88._0_4_;
  auVar9._12_4_ = local_88._0_4_;
  RVar15.b = auVar13._0_4_ / (float)local_88._0_4_;
  auVar13 = vdivps_avx(local_78,auVar9);
  RVar15._0_8_ = auVar13._0_8_;
  return RVar15;
}

Assistant:

inline Triplet PixelSensor::ProjectReflectance(SpectrumHandle refl, SpectrumHandle illum,
                                               SpectrumHandle b1, SpectrumHandle b2,
                                               SpectrumHandle b3) {
    Triplet result;
    Float g_integral = 0;
    for (Float lambda = Lambda_min; lambda <= Lambda_max; ++lambda) {
        g_integral += b2(lambda) * illum(lambda);
        result[0] += b1(lambda) * refl(lambda) * illum(lambda);
        result[1] += b2(lambda) * refl(lambda) * illum(lambda);
        result[2] += b3(lambda) * refl(lambda) * illum(lambda);
    }
    return result / g_integral;
}